

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O3

Result __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::simplifyDual(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *lp,bool *again)

{
  undefined8 *puVar1;
  uint *puVar2;
  char cVar3;
  char cVar4;
  byte bVar5;
  undefined4 uVar6;
  Item *pIVar7;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar8;
  undefined8 uVar9;
  int *piVar10;
  SPxOut *pSVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar15;
  __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
  _Var16;
  int iVar17;
  int iVar18;
  FreeConstraintPS *this_00;
  pointer pnVar19;
  cpp_dec_float<50U,_int,_void> *pcVar20;
  FixBoundsPS *pFVar21;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  uint uVar23;
  ulong uVar24;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *pAVar25;
  Result RVar26;
  cpp_dec_float<50U,_int,_void> *pcVar27;
  long lVar28;
  cpp_dec_float<50u,int,void> *this_01;
  long lVar29;
  long lVar30;
  long in_FS_OFFSET;
  double a;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bound;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualConsUp;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualConsLo;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualVarUp;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualVarLo;
  undefined1 local_6d8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_6d0;
  uint local_6c8 [3];
  undefined3 uStack_6bb;
  uint local_6b8;
  undefined3 uStack_6b3;
  int local_6b0;
  bool local_6ac;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_6a8;
  SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_6a0;
  undefined1 local_698 [16];
  uint local_688 [3];
  undefined3 uStack_67b;
  uint local_678;
  undefined3 uStack_673;
  int local_670;
  bool local_66c;
  undefined8 local_668;
  int local_65c;
  undefined1 local_658 [16];
  uint local_648 [3];
  undefined3 uStack_63b;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_638;
  int local_630;
  bool local_62c;
  undefined8 local_628;
  int local_61c;
  double local_618;
  undefined8 uStack_610;
  int local_5fc;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_5f8;
  undefined8 uStack_5f0;
  double local_5e8;
  undefined8 uStack_5e0;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_5d8;
  undefined8 uStack_5d0;
  undefined1 local_5c8 [40];
  int local_5a0;
  bool local_59c;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_598;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_590;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_588;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_570;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_558;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_540;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_528;
  undefined8 uStack_520;
  shared_ptr<soplex::Tolerances> local_518;
  shared_ptr<soplex::Tolerances> local_508;
  shared_ptr<soplex::Tolerances> local_4f8;
  shared_ptr<soplex::Tolerances> local_4e8;
  shared_ptr<soplex::Tolerances> local_4d8;
  element_type *local_4c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_4c0;
  uint local_4b8 [2];
  undefined8 uStack_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_4a8;
  undefined1 local_498 [29];
  undefined3 uStack_47b;
  undefined1 auStack_478 [13];
  undefined8 local_468;
  bool *local_460;
  long local_458;
  long local_450;
  uint local_448 [2];
  uint auStack_440 [2];
  uint local_438 [2];
  uint auStack_430 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_428;
  undefined8 local_418;
  undefined8 uStack_410;
  uint local_408 [2];
  undefined8 uStack_400;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3f8;
  uint local_3e8 [2];
  uint auStack_3e0 [2];
  uint local_3d8 [2];
  uint auStack_3d0 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_3c8;
  uint local_3b8 [2];
  uint auStack_3b0 [2];
  uint local_3a8 [2];
  uint auStack_3a0 [2];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_398;
  undefined8 local_388;
  undefined8 uStack_380;
  uint local_378 [2];
  undefined8 uStack_370;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_368;
  undefined8 local_358;
  undefined8 uStack_350;
  uint local_348 [2];
  undefined8 uStack_340;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_338;
  element_type *local_328;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_320;
  uint local_318 [2];
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  uint local_2e8 [2];
  undefined8 uStack_2e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_2d8;
  element_type *local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2c0;
  uint local_2b8 [2];
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_298;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_258;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_218;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1d8;
  int local_198;
  int local_194;
  bool *local_190;
  undefined8 local_188;
  undefined1 local_180 [40];
  int local_158;
  bool local_154;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_150;
  undefined1 local_148 [40];
  int local_120;
  bool local_11c;
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *local_118;
  cpp_dec_float<50U,_int,_void> local_110;
  cpp_dec_float<50U,_int,_void> local_d8;
  cpp_dec_float<50U,_int,_void> local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar17 = (lp->
           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  iVar18 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  local_198 = 0;
  if (0 < iVar18) {
    local_198 = iVar18;
  }
  local_190 = (bool *)0x0;
  local_188 = 0x3ff3333333333333;
  local_194 = 1;
  if (0 < (long)iVar18) {
    local_194 = local_198;
  }
  spx_alloc<bool*>(&local_190,local_194);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_540,
               (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_558,
               (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_570,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  local_6a0 = this;
  local_460 = again;
  local_458 = (long)iVar17;
  local_450 = (long)iVar18;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(&local_588,
               (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
  uVar24 = (ulong)(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
  local_61c = 0;
  local_5fc = 0;
  if (0 < (long)uVar24) {
    local_618 = *(double *)(in_FS_OFFSET + -8);
    uStack_610 = 0;
    local_5e8 = -local_618;
    uStack_5e0 = 0x8000000000000000;
    local_5d8 = &local_6a0->m_hist;
    lVar28 = uVar24 * 0x38;
    local_5fc = 0;
    local_61c = 0;
    do {
      pnVar19 = (lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).left.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ::soplex::infinity::__tls_init();
      local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                   *)0xa00000000;
      local_6d8 = (undefined1  [8])0x0;
      _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_6c8[0] = 0;
      local_6c8[1] = 0;
      stack0xfffffffffffff940 = 0;
      uStack_6bb = 0;
      _local_6b8 = 0;
      uStack_6b3 = 0;
      local_6b0 = 0;
      local_6ac = false;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)local_6d8,local_5e8);
      if (((*(int *)((long)(pnVar19->m_backend).data._M_elems + lVar28 + -8) == 2) ||
          ((fpclass_type)local_6a8 == cpp_dec_float_NaN)) ||
         (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)
                              ((long)pnVar19[-1].m_backend.data._M_elems + lVar28),
                              (cpp_dec_float<50U,_int,_void> *)local_6d8), 0 < iVar17)) {
LAB_002e2b34:
        pnVar19 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).left.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_668._0_4_ = cpp_dec_float_finite;
        local_668._4_4_ = 10;
        local_698._0_8_ = (element_type *)0x0;
        local_698._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_688[0] = 0;
        local_688[1] = 0;
        stack0xfffffffffffff980 = 0;
        uStack_67b = 0;
        _local_678 = 0;
        uStack_673 = 0;
        local_670 = 0;
        local_66c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_698,local_5e8);
        if (((*(int *)((long)(pnVar19->m_backend).data._M_elems + lVar28 + -8) == 2) ||
            ((fpclass_type)local_668 == cpp_dec_float_NaN)) ||
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)pnVar19[-1].m_backend.data._M_elems + lVar28),
                                (cpp_dec_float<50U,_int,_void> *)local_698), 0 < iVar17)) {
          ::soplex::infinity::__tls_init();
          local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                       *)0xa00000000;
          _local_6d8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        )ZEXT816(0);
          local_6c8[0] = 0;
          local_6c8[1] = 0;
          stack0xfffffffffffff940 = 0;
          uStack_6bb = 0;
          _local_6b8 = 0;
          uStack_6b3 = 0;
          local_6b0 = 0;
          local_6ac = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6d8,local_5e8);
        }
        else {
          local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                       *)0xa00000000;
          _local_6d8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                        )ZEXT816(0);
          local_6c8[0] = 0;
          local_6c8[1] = 0;
          stack0xfffffffffffff940 = 0;
          uStack_6bb = 0;
          _local_6b8 = 0;
          uStack_6b3 = 0;
          local_6b0 = 0;
          local_6ac = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6d8,0.0);
        }
        *(ulong *)((long)((local_540.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                  lVar28 + -0x18) = CONCAT35(uStack_6b3,_local_6b8);
        puVar2 = (uint *)((long)(&((local_540.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + -1
                                ) + lVar28);
        *(undefined8 *)puVar2 = local_6c8._0_8_;
        *(ulong *)(puVar2 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
        puVar2 = (uint *)((long)local_540.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar28);
        *(undefined1 (*) [8])puVar2 = local_6d8;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar2 + 2) = _Stack_6d0._M_pi;
        *(int *)((long)((local_540.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                lVar28 + -0x10) = local_6b0;
        *(bool *)((long)((local_540.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar28 + -0xc) = local_6ac;
        *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
          **)((long)((local_540.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
             lVar28 + -8) = local_6a8;
        pnVar19 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_668 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0xa00000000;
        local_698 = ZEXT816(0);
        local_688[0] = 0;
        local_688[1] = 0;
        stack0xfffffffffffff980 = 0;
        uStack_67b = 0;
        _local_678 = 0;
        uStack_673 = 0;
        local_670 = 0;
        local_66c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_698,local_618);
        if ((*(int *)((long)(pnVar19->m_backend).data._M_elems + lVar28 + -8) == 2) ||
           ((fpclass_type)local_668 == cpp_dec_float_NaN)) {
LAB_002e2cbf:
          ::soplex::infinity::__tls_init();
          a = local_618;
        }
        else {
          iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)
                              ((long)pnVar19[-1].m_backend.data._M_elems + lVar28),
                              (cpp_dec_float<50U,_int,_void> *)local_698);
          a = 0.0;
          if (iVar17 < 0) goto LAB_002e2cbf;
        }
        local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0xa00000000;
        _local_6d8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                      )ZEXT816(0);
        local_6c8[0] = 0;
        local_6c8[1] = 0;
        stack0xfffffffffffff940 = 0;
        uStack_6bb = 0;
        _local_6b8 = 0;
        uStack_6b3 = 0;
        local_6b0 = 0;
        local_6ac = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_6d8,a);
        *(ulong *)((long)((local_558.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                  lVar28 + -0x18) = CONCAT35(uStack_6b3,_local_6b8);
        puVar2 = (uint *)((long)(&((local_558.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data + -1
                                ) + lVar28);
        *(undefined8 *)puVar2 = local_6c8._0_8_;
        *(ulong *)(puVar2 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
        puVar2 = (uint *)((long)local_558.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar28);
        *(undefined1 (*) [8])puVar2 = local_6d8;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(puVar2 + 2) = _Stack_6d0._M_pi;
        *(int *)((long)((local_558.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                lVar28 + -0x10) = local_6b0;
        *(bool *)((long)((local_558.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                 lVar28 + -0xc) = local_6ac;
        *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
          **)((long)((local_558.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
             lVar28 + -8) = local_6a8;
      }
      else {
        pnVar19 = (lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).right.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ::soplex::infinity::__tls_init();
        local_668 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0xa00000000;
        local_698._0_8_ = (element_type *)0x0;
        local_698._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_688[0] = 0;
        local_688[1] = 0;
        stack0xfffffffffffff980 = 0;
        uStack_67b = 0;
        _local_678 = 0;
        uStack_673 = 0;
        local_670 = 0;
        local_66c = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)local_698,local_618);
        if (((*(int *)((long)(pnVar19->m_backend).data._M_elems + lVar28 + -8) == 2) ||
            ((fpclass_type)local_668 == cpp_dec_float_NaN)) ||
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)
                                ((long)pnVar19[-1].m_backend.data._M_elems + lVar28),
                                (cpp_dec_float<50U,_int,_void> *)local_698), iVar17 < 0))
        goto LAB_002e2b34;
        this_00 = (FreeConstraintPS *)operator_new(0x88);
        local_4d8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (local_6a0->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        local_4d8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (local_6a0->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
        if (local_4d8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_4d8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_4d8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_4d8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_4d8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        local_5f8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)(uVar24 - 1);
        FreeConstraintPS::FreeConstraintPS(this_00,lp,(int)local_5f8,&local_4d8);
        local_6d8 = (undefined1  [8])this_00;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FreeConstraintPS*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6d8 + 8),this_00);
        if (local_4d8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_4d8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&local_5d8->data,(value_type *)local_6d8);
        pSVar15 = local_6a0;
        iVar17 = (lp->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.theitem
                 [(lp->
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thekey[uVar24 - 1].idx].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .memused;
        piVar10 = (local_6a0->m_rIdx).data;
        piVar10[uVar24 - 1] =
             piVar10[(long)(lp->
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum + -1];
        (*(lp->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0xf])();
        piVar10 = (pSVar15->m_stat).data + 1;
        *piVar10 = *piVar10 + 1;
        if (_Stack_6d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_6d0._M_pi);
        }
        local_5fc = local_5fc + 1;
        local_61c = local_61c + iVar17;
      }
      lVar28 = lVar28 + -0x38;
      bVar12 = 1 < uVar24;
      uVar24 = uVar24 - 1;
    } while (bVar12);
  }
  iVar17 = (lp->
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum;
  if (iVar17 < 1) {
LAB_002e5040:
    local_65c = 0;
  }
  else {
    local_618 = *(double *)(in_FS_OFFSET + -8);
    uStack_610 = 0;
    local_5e8 = -local_618;
    uStack_5e0 = 0x8000000000000000;
    lVar28 = 0;
    lVar29 = 0;
    do {
      pIVar7 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar18 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar29].idx;
      if (pIVar7[iVar18].data.
          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .memused == 1) {
        pNVar8 = pIVar7[iVar18].data.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        iVar17 = pNVar8->idx;
        uVar9 = *(undefined8 *)((pNVar8->val).m_backend.data._M_elems + 8);
        _local_678 = (undefined5)uVar9;
        uStack_673 = (undefined3)((ulong)uVar9 >> 0x28);
        local_698 = *(undefined1 (*) [16])&(pNVar8->val).m_backend.data;
        local_688._0_8_ = *(undefined8 *)((pNVar8->val).m_backend.data._M_elems + 4);
        uVar9 = *(undefined8 *)((pNVar8->val).m_backend.data._M_elems + 6);
        stack0xfffffffffffff980 = (undefined5)uVar9;
        uStack_67b = (undefined3)((ulong)uVar9 >> 0x28);
        local_670 = (pNVar8->val).m_backend.exp;
        local_66c = (pNVar8->val).m_backend.neg;
        local_668 = *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                      **)&(pNVar8->val).m_backend.fpclass;
        local_628 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)0xa00000000;
        local_658 = (undefined1  [16])0x0;
        local_648[0] = 0;
        local_648[1] = 0;
        stack0xfffffffffffff9c0 = 0;
        uStack_63b = 0;
        local_638 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)0x0;
        local_630 = 0;
        local_62c = false;
        boost::multiprecision::default_ops::
        eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                  ((cpp_dec_float<50U,_int,_void> *)local_658,
                   (cpp_dec_float<50U,_int,_void> *)
                   ((long)(((lp->
                            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).object.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar28),(cpp_dec_float<50U,_int,_void> *)local_698);
        if ((fpclass_type)local_668 != cpp_dec_float_NaN) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                    ((cpp_dec_float<50U,_int,_void> *)local_6d8,0,(type *)0x0);
          iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                             ((cpp_dec_float<50U,_int,_void> *)local_698,
                              (cpp_dec_float<50U,_int,_void> *)local_6d8);
          if (iVar18 < 1) {
            if ((fpclass_type)local_668 != cpp_dec_float_NaN) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
              cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_6d8,0,(type *)0x0);
              iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_698,
                                  (cpp_dec_float<50U,_int,_void> *)local_6d8);
              if (iVar18 < 0) {
                pnVar19 = (lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ::soplex::infinity::__tls_init();
                local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                             *)0xa00000000;
                local_6d8 = (undefined1  [8])0x0;
                _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_6c8[0] = 0;
                local_6c8[1] = 0;
                stack0xfffffffffffff940 = 0;
                uStack_6bb = 0;
                _local_6b8 = 0;
                uStack_6b3 = 0;
                local_6b0 = 0;
                local_6ac = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)local_6d8,local_5e8);
                if (((((*(int *)((long)(&(pnVar19->m_backend).data + 1) + lVar28 + 8U) != 2) &&
                      ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) &&
                     (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare((cpp_dec_float<50U,_int,_void> *)
                                       ((long)(pnVar19->m_backend).data._M_elems + lVar28),
                                       (cpp_dec_float<50U,_int,_void> *)local_6d8), iVar18 < 1)) &&
                    (((fpclass_type)local_628 != cpp_dec_float_NaN &&
                     (local_540.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass !=
                      cpp_dec_float_NaN)))) &&
                   (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                       ((cpp_dec_float<50U,_int,_void> *)local_658,
                                        &local_540.val.
                                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend
                                       ), 0 < iVar18)) {
                  *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    **)(local_540.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems +
                       8) = local_638;
                  puVar2 = local_540.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems
                           + 4;
                  *(undefined8 *)puVar2 = local_648._0_8_;
                  *(ulong *)(puVar2 + 2) = CONCAT35(uStack_63b,stack0xfffffffffffff9c0);
                  *(undefined8 *)
                   local_540.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems =
                       local_658._0_8_;
                  *(undefined8 *)
                   (local_540.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 2) =
                       local_658._8_8_;
                  local_540.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.exp = local_630;
                  local_540.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.neg = local_62c;
                  *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                    **)&local_540.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass =
                       local_628;
                }
                pnVar19 = (lp->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                ::soplex::infinity::__tls_init();
                local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                             *)0xa00000000;
                _local_6d8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              )ZEXT816(0);
                local_6c8[0] = 0;
                local_6c8[1] = 0;
                stack0xfffffffffffff940 = 0;
                uStack_6bb = 0;
                _local_6b8 = 0;
                uStack_6b3 = 0;
                local_6b0 = 0;
                local_6ac = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)local_6d8,local_618);
                if (((*(int *)((long)(&(pnVar19->m_backend).data + 1) + lVar28 + 8U) != 2) &&
                    ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) &&
                   ((iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                              compare((cpp_dec_float<50U,_int,_void> *)
                                      ((long)(pnVar19->m_backend).data._M_elems + lVar28),
                                      (cpp_dec_float<50U,_int,_void> *)local_6d8), -1 < iVar18 &&
                    ((((fpclass_type)local_628 != cpp_dec_float_NaN &&
                      (local_558.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass !=
                       cpp_dec_float_NaN)) &&
                     (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare((cpp_dec_float<50U,_int,_void> *)local_658,
                                       &local_558.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend)
                     , iVar18 < 0)))))) {
                  *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    **)(local_558.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems +
                       8) = local_638;
                  puVar2 = local_558.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems
                           + 4;
                  *(undefined8 *)puVar2 = local_648._0_8_;
                  *(ulong *)(puVar2 + 2) = CONCAT35(uStack_63b,stack0xfffffffffffff9c0);
                  *(undefined8 *)
                   local_558.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems =
                       local_658._0_8_;
                  *(undefined8 *)
                   (local_558.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 2) =
                       local_658._8_8_;
                  local_558.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.exp = local_630;
                  local_558.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.neg = local_62c;
                  *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                    **)&local_558.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass =
                       local_628;
                }
              }
            }
          }
          else {
            pnVar19 = (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                         *)0xa00000000;
            local_6d8 = (undefined1  [8])0x0;
            _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_6c8[0] = 0;
            local_6c8[1] = 0;
            stack0xfffffffffffff940 = 0;
            uStack_6bb = 0;
            _local_6b8 = 0;
            uStack_6b3 = 0;
            local_6b0 = 0;
            local_6ac = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6d8,local_5e8);
            if (((*(int *)((long)(&(pnVar19->m_backend).data + 1) + lVar28 + 8U) != 2) &&
                ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) &&
               (((iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     ((cpp_dec_float<50U,_int,_void> *)
                                      ((long)(pnVar19->m_backend).data._M_elems + lVar28),
                                      (cpp_dec_float<50U,_int,_void> *)local_6d8), iVar18 < 1 &&
                 (((fpclass_type)local_628 != cpp_dec_float_NaN &&
                  (local_558.val.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass !=
                   cpp_dec_float_NaN)))) &&
                (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)local_658,
                                     &local_558.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend),
                iVar18 < 0)))) {
              *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                **)(local_558.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 8) =
                   local_638;
              puVar2 = local_558.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 4
              ;
              *(undefined8 *)puVar2 = local_648._0_8_;
              *(ulong *)(puVar2 + 2) = CONCAT35(uStack_63b,stack0xfffffffffffff9c0);
              *(undefined8 *)
               local_558.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems =
                   local_658._0_8_;
              *(undefined8 *)
               (local_558.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 2) =
                   local_658._8_8_;
              local_558.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.exp = local_630;
              local_558.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.neg = local_62c;
              *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                **)&local_558.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass = local_628;
            }
            pnVar19 = (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                         *)0xa00000000;
            _local_6d8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                          )ZEXT816(0);
            local_6c8[0] = 0;
            local_6c8[1] = 0;
            stack0xfffffffffffff940 = 0;
            uStack_6bb = 0;
            _local_6b8 = 0;
            uStack_6b3 = 0;
            local_6b0 = 0;
            local_6ac = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6d8,local_618);
            if ((((*(int *)((long)(&(pnVar19->m_backend).data + 1) + lVar28 + 8U) != 2) &&
                 ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) &&
                (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)
                                     ((long)(pnVar19->m_backend).data._M_elems + lVar28),
                                     (cpp_dec_float<50U,_int,_void> *)local_6d8), -1 < iVar18)) &&
               ((((fpclass_type)local_628 != cpp_dec_float_NaN &&
                 (local_540.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass !=
                  cpp_dec_float_NaN)) &&
                (iVar18 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                    ((cpp_dec_float<50U,_int,_void> *)local_658,
                                     &local_540.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend),
                0 < iVar18)))) {
              *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                **)(local_540.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 8) =
                   local_638;
              puVar2 = local_540.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 4
              ;
              *(undefined8 *)puVar2 = local_648._0_8_;
              *(ulong *)(puVar2 + 2) = CONCAT35(uStack_63b,stack0xfffffffffffff9c0);
              *(undefined8 *)
               local_540.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems =
                   local_658._0_8_;
              *(undefined8 *)
               (local_540.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.data._M_elems + 2) =
                   local_658._8_8_;
              local_540.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.exp = local_630;
              local_540.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.neg = local_62c;
              *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                **)&local_540.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[iVar17].m_backend.fpclass = local_628;
            }
          }
        }
        iVar17 = (lp->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .set.thenum;
      }
      lVar29 = lVar29 + 1;
      lVar28 = lVar28 + 0x38;
    } while (lVar29 < iVar17);
    if (iVar17 < 1) goto LAB_002e5040;
    pAVar25 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
               *)0x0;
    do {
      this_01 = (cpp_dec_float<50u,int,void> *)
                (local_588.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (long)pAVar25);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(this_01,0.0);
      *(undefined8 *)
       (local_570.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.data._M_elems + 8) =
           *(undefined8 *)(this_01 + 0x20);
      uVar13 = *(undefined8 *)this_01;
      uVar14 = *(undefined8 *)(this_01 + 8);
      uVar9 = *(undefined8 *)(this_01 + 0x18);
      puVar2 = local_570.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = *(undefined8 *)(this_01 + 0x10);
      *(undefined8 *)(puVar2 + 2) = uVar9;
      *(undefined8 *)
       local_570.val.
       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
       ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.data._M_elems = uVar13;
      *(undefined8 *)
       (local_570.val.
        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.data._M_elems + 2) =
           uVar14;
      local_570.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.exp =
           *(int *)(this_01 + 0x28);
      local_570.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.neg = (bool)this_01[0x2c];
      uVar9 = *(undefined8 *)(this_01 + 0x30);
      local_570.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.fpclass = (int)uVar9;
      local_570.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.prec_elem =
           (int)((ulong)uVar9 >> 0x20);
      pIVar7 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem;
      iVar17 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[(long)pAVar25].idx;
      local_5d8 = pAVar25;
      if (0 < pIVar7[iVar17].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        pIVar7 = pIVar7 + iVar17;
        lVar29 = 0;
        lVar28 = 0;
        do {
          pcVar27 = &local_570.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend;
          ::soplex::infinity::__tls_init();
          local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                       *)0xa00000000;
          local_6d8 = (undefined1  [8])0x0;
          _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_6c8[0] = 0;
          local_6c8[1] = 0;
          stack0xfffffffffffff940 = 0;
          uStack_6bb = 0;
          _local_6b8 = 0;
          uStack_6b3 = 0;
          local_6b0 = 0;
          local_6ac = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6d8,local_5e8);
          if (((pcVar27->fpclass != cpp_dec_float_NaN) &&
              ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 (pcVar27,(cpp_dec_float<50U,_int,_void> *)local_6d8), iVar17 < 1))
          {
            pcVar27 = &local_588.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend;
            ::soplex::infinity::__tls_init();
            local_668 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                         *)0xa00000000;
            local_698._0_8_ = (element_type *)0x0;
            local_698._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_688[0] = 0;
            local_688[1] = 0;
            stack0xfffffffffffff980 = 0;
            uStack_67b = 0;
            _local_678 = 0;
            uStack_673 = 0;
            local_670 = 0;
            local_66c = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_698,local_618);
            if (((pcVar27->fpclass != cpp_dec_float_NaN) &&
                ((fpclass_type)local_668 != cpp_dec_float_NaN)) &&
               (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   (pcVar27,(cpp_dec_float<50U,_int,_void> *)local_698), -1 < iVar17
               )) break;
          }
          pNVar8 = (pIVar7->data).
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .m_elem;
          uVar9 = *(undefined8 *)((long)(pNVar8->val).m_backend.data._M_elems + lVar29 + 0x20);
          _local_678 = (undefined5)uVar9;
          uStack_673 = (undefined3)((ulong)uVar9 >> 0x28);
          local_698 = *(undefined1 (*) [16])((long)(pNVar8->val).m_backend.data._M_elems + lVar29);
          puVar2 = (uint *)((long)(pNVar8->val).m_backend.data._M_elems + lVar29 + 0x10);
          local_688._0_8_ = *(undefined8 *)puVar2;
          uVar9 = *(undefined8 *)(puVar2 + 2);
          stack0xfffffffffffff980 = (undefined5)uVar9;
          uStack_67b = (undefined3)((ulong)uVar9 >> 0x28);
          local_670 = *(int *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar29);
          local_66c = *(bool *)((long)(&(pNVar8->val).m_backend.data + 1) + lVar29 + 4);
          local_668 = *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                        **)((long)(&(pNVar8->val).m_backend.data + 1) + lVar29 + 8);
          if ((int)local_668 != 2) {
            lVar30 = (long)*(int *)((long)(&((pIVar7->data).
                                             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                            .m_elem)->val + 1) + lVar29);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                      ((cpp_dec_float<50U,_int,_void> *)local_6d8,0,(type *)0x0);
            iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_698,
                                (cpp_dec_float<50U,_int,_void> *)local_6d8);
            if (iVar17 < 1) {
              if ((fpclass_type)local_668 != cpp_dec_float_NaN) {
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                cpp_dec_float<long_long>((cpp_dec_float<50U,_int,_void> *)local_6d8,0,(type *)0x0);
                iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_698,
                                    (cpp_dec_float<50U,_int,_void> *)local_6d8);
                if (iVar17 < 0) {
                  local_5f8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                               *)(lVar30 * 0x38);
                  pcVar27 = &local_540.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
                  ::soplex::infinity::__tls_init();
                  local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                               *)0xa00000000;
                  local_6d8 = (undefined1  [8])0x0;
                  _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_6c8[0] = 0;
                  local_6c8[1] = 0;
                  stack0xfffffffffffff940 = 0;
                  uStack_6bb = 0;
                  _local_6b8 = 0;
                  uStack_6b3 = 0;
                  local_6b0 = 0;
                  local_6ac = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)local_6d8,local_5e8);
                  if (((pcVar27->fpclass == cpp_dec_float_NaN) ||
                      ((fpclass_type)local_6a8 == cpp_dec_float_NaN)) ||
                     (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar27,(cpp_dec_float<50U,_int,_void> *)local_6d8),
                     0 < iVar17)) {
                    pcVar20 = (cpp_dec_float<50U,_int,_void> *)
                              ((long)((local_540.val.
                                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                     _M_elems + (long)local_5f8);
                    local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                 *)0xa00000000;
                    _local_6d8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  )ZEXT816(0);
                    local_6c8[0] = 0;
                    local_6c8[1] = 0;
                    stack0xfffffffffffff940 = 0;
                    uStack_6bb = 0;
                    _local_6b8 = 0;
                    uStack_6b3 = 0;
                    local_6b0 = 0;
                    local_6ac = false;
                    pcVar27 = (cpp_dec_float<50U,_int,_void> *)local_698;
                    if ((cpp_dec_float<50U,_int,_void> *)local_6d8 != pcVar20) {
                      _local_6b8 = _local_678;
                      uStack_6b3 = uStack_673;
                      local_6c8[0] = local_688[0];
                      local_6c8[1] = local_688[1];
                      stack0xfffffffffffff940 = stack0xfffffffffffff980;
                      uStack_6bb = uStack_67b;
                      local_6d8 = (undefined1  [8])local_698._0_8_;
                      _Stack_6d0._M_pi =
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_698._8_8_;
                      local_6b0 = local_670;
                      local_6ac = local_66c;
                      local_6a8 = local_668;
                      pcVar27 = pcVar20;
                    }
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                              ((cpp_dec_float<50U,_int,_void> *)local_6d8,pcVar27);
                    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                              (&local_588.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend,
                               (cpp_dec_float<50U,_int,_void> *)local_6d8);
                  }
                  else {
                    ::soplex::infinity::__tls_init();
                    local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                 *)0xa00000000;
                    _local_6d8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                  )ZEXT816(0);
                    local_6c8[0] = 0;
                    local_6c8[1] = 0;
                    stack0xfffffffffffff940 = 0;
                    uStack_6bb = 0;
                    _local_6b8 = 0;
                    uStack_6b3 = 0;
                    local_6b0 = 0;
                    local_6ac = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)local_6d8,local_618);
                    *(ulong *)(local_588.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.
                               data._M_elems + 8) = CONCAT35(uStack_6b3,_local_6b8);
                    puVar2 = local_588.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.data
                             ._M_elems + 4;
                    *(undefined8 *)puVar2 = local_6c8._0_8_;
                    *(ulong *)(puVar2 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
                    *(undefined1 (*) [8])
                     local_588.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.data.
                     _M_elems = local_6d8;
                    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     (local_588.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.data.
                      _M_elems + 2) = _Stack_6d0._M_pi;
                    local_588.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.exp =
                         local_6b0;
                    local_588.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.neg =
                         local_6ac;
                    *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                      **)&local_588.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.fpclass
                         = local_6a8;
                  }
                  pcVar27 = (cpp_dec_float<50U,_int,_void> *)
                            ((long)((local_558.val.
                                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_backend).data.
                                   _M_elems + (long)local_5f8);
                  ::soplex::infinity::__tls_init();
                  local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                               *)0xa00000000;
                  _local_6d8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                )ZEXT816(0);
                  local_6c8[0] = 0;
                  local_6c8[1] = 0;
                  stack0xfffffffffffff940 = 0;
                  uStack_6bb = 0;
                  _local_6b8 = 0;
                  uStack_6b3 = 0;
                  local_6b0 = 0;
                  local_6ac = false;
                  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                            ((cpp_dec_float<50u,int,void> *)local_6d8,local_618);
                  if (((pcVar27->fpclass != cpp_dec_float_NaN) &&
                      ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) &&
                     (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::
                               compare(pcVar27,(cpp_dec_float<50U,_int,_void> *)local_6d8),
                     -1 < iVar17)) {
                    ::soplex::infinity::__tls_init();
                    local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                                 *)0xa00000000;
                    local_6d8 = (undefined1  [8])0x0;
                    _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                    local_6c8[0] = 0;
                    local_6c8[1] = 0;
                    stack0xfffffffffffff940 = 0;
                    uStack_6bb = 0;
                    _local_6b8 = 0;
                    uStack_6b3 = 0;
                    local_6b0 = 0;
                    local_6ac = false;
                    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                              ((cpp_dec_float<50u,int,void> *)local_6d8,local_5e8);
                    pnVar19 = local_570.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    goto LAB_002e38c0;
                  }
                  pcVar20 = (cpp_dec_float<50U,_int,_void> *)
                            ((long)&(local_5f8->data).
                                    super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (long)local_558.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                  local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                               *)0xa00000000;
                  local_6d8 = (undefined1  [8])0x0;
                  _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_6c8[0] = 0;
                  local_6c8[1] = 0;
                  stack0xfffffffffffff940 = 0;
                  uStack_6bb = 0;
                  _local_6b8 = 0;
                  uStack_6b3 = 0;
                  local_6b0 = 0;
                  local_6ac = false;
                  pcVar27 = (cpp_dec_float<50U,_int,_void> *)local_698;
                  if ((cpp_dec_float<50U,_int,_void> *)local_6d8 != pcVar20) {
                    _local_6b8 = _local_678;
                    uStack_6b3 = uStack_673;
                    local_6c8[0] = local_688[0];
                    local_6c8[1] = local_688[1];
                    stack0xfffffffffffff940 = stack0xfffffffffffff980;
                    uStack_6bb = uStack_67b;
                    local_6d8 = (undefined1  [8])local_698._0_8_;
                    _Stack_6d0._M_pi =
                         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_698._8_8_;
                    local_6b0 = local_670;
                    local_6ac = local_66c;
                    local_6a8 = local_668;
                    pcVar27 = pcVar20;
                  }
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                            ((cpp_dec_float<50U,_int,_void> *)local_6d8,pcVar27);
                  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                            (&local_570.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend,
                             (cpp_dec_float<50U,_int,_void> *)local_6d8);
                }
              }
            }
            else {
              pcVar27 = &local_540.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
              ::soplex::infinity::__tls_init();
              local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                           *)0xa00000000;
              local_6d8 = (undefined1  [8])0x0;
              _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_6c8[0] = 0;
              local_6c8[1] = 0;
              stack0xfffffffffffff940 = 0;
              uStack_6bb = 0;
              _local_6b8 = 0;
              uStack_6b3 = 0;
              local_6b0 = 0;
              local_6ac = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_6d8,local_5e8);
              if (((pcVar27->fpclass == cpp_dec_float_NaN) ||
                  ((fpclass_type)local_6a8 == cpp_dec_float_NaN)) ||
                 (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar27,(cpp_dec_float<50U,_int,_void> *)local_6d8),
                 0 < iVar17)) {
                local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                             *)0xa00000000;
                _local_6d8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              )ZEXT816(0);
                local_6c8[0] = 0;
                local_6c8[1] = 0;
                stack0xfffffffffffff940 = 0;
                uStack_6bb = 0;
                _local_6b8 = 0;
                uStack_6b3 = 0;
                local_6b0 = 0;
                local_6ac = false;
                pcVar27 = (cpp_dec_float<50U,_int,_void> *)local_698;
                if ((cpp_dec_float<50U,_int,_void> *)local_6d8 !=
                    &local_540.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend) {
                  _local_6b8 = _local_678;
                  uStack_6b3 = uStack_673;
                  local_6c8[0] = local_688[0];
                  local_6c8[1] = local_688[1];
                  stack0xfffffffffffff940 = stack0xfffffffffffff980;
                  uStack_6bb = uStack_67b;
                  local_6d8 = (undefined1  [8])local_698._0_8_;
                  _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_698._8_8_
                  ;
                  local_6b0 = local_670;
                  local_6ac = local_66c;
                  local_6a8 = local_668;
                  pcVar27 = &local_540.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          ((cpp_dec_float<50U,_int,_void> *)local_6d8,pcVar27);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&local_570.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend,
                           (cpp_dec_float<50U,_int,_void> *)local_6d8);
              }
              else {
                ::soplex::infinity::__tls_init();
                local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                             *)0xa00000000;
                _local_6d8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              )ZEXT816(0);
                local_6c8[0] = 0;
                local_6c8[1] = 0;
                stack0xfffffffffffff940 = 0;
                uStack_6bb = 0;
                _local_6b8 = 0;
                uStack_6b3 = 0;
                local_6b0 = 0;
                local_6ac = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)local_6d8,local_5e8);
                *(ulong *)(local_570.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.data.
                           _M_elems + 8) = CONCAT35(uStack_6b3,_local_6b8);
                puVar2 = local_570.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.data.
                         _M_elems + 4;
                *(undefined8 *)puVar2 = local_6c8._0_8_;
                *(ulong *)(puVar2 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
                *(undefined1 (*) [8])
                 local_570.val.
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.data._M_elems =
                     local_6d8;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 (local_570.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.data._M_elems +
                 2) = _Stack_6d0._M_pi;
                local_570.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.exp = local_6b0;
                local_570.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.neg = local_6ac;
                *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                  **)&local_570.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend.fpclass =
                     local_6a8;
              }
              pcVar27 = &local_558.val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
              ::soplex::infinity::__tls_init();
              local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                           *)0xa00000000;
              _local_6d8 = (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                            )ZEXT816(0);
              local_6c8[0] = 0;
              local_6c8[1] = 0;
              stack0xfffffffffffff940 = 0;
              uStack_6bb = 0;
              _local_6b8 = 0;
              uStack_6b3 = 0;
              local_6b0 = 0;
              local_6ac = false;
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)local_6d8,local_618);
              if (((pcVar27->fpclass == cpp_dec_float_NaN) ||
                  ((fpclass_type)local_6a8 == cpp_dec_float_NaN)) ||
                 (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                     (pcVar27,(cpp_dec_float<50U,_int,_void> *)local_6d8),
                 iVar17 < 0)) {
                local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                             *)0xa00000000;
                local_6d8 = (undefined1  [8])0x0;
                _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_6c8[0] = 0;
                local_6c8[1] = 0;
                stack0xfffffffffffff940 = 0;
                uStack_6bb = 0;
                _local_6b8 = 0;
                uStack_6b3 = 0;
                local_6b0 = 0;
                local_6ac = false;
                pcVar27 = (cpp_dec_float<50U,_int,_void> *)local_698;
                if ((cpp_dec_float<50U,_int,_void> *)local_6d8 !=
                    &local_558.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend) {
                  _local_6b8 = _local_678;
                  uStack_6b3 = uStack_673;
                  local_6c8[0] = local_688[0];
                  local_6c8[1] = local_688[1];
                  stack0xfffffffffffff940 = stack0xfffffffffffff980;
                  uStack_6bb = uStack_67b;
                  local_6d8 = (undefined1  [8])local_698._0_8_;
                  _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_698._8_8_
                  ;
                  local_6b0 = local_670;
                  local_6ac = local_66c;
                  local_6a8 = local_668;
                  pcVar27 = &local_558.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar30].m_backend;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          ((cpp_dec_float<50U,_int,_void> *)local_6d8,pcVar27);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&local_588.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)pAVar25].m_backend,
                           (cpp_dec_float<50U,_int,_void> *)local_6d8);
              }
              else {
                ::soplex::infinity::__tls_init();
                local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                             *)0xa00000000;
                local_6d8 = (undefined1  [8])0x0;
                _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_6c8[0] = 0;
                local_6c8[1] = 0;
                stack0xfffffffffffff940 = 0;
                uStack_6bb = 0;
                _local_6b8 = 0;
                uStack_6b3 = 0;
                local_6b0 = 0;
                local_6ac = false;
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)local_6d8,local_618);
                pnVar19 = local_588.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
LAB_002e38c0:
                *(ulong *)(pnVar19[(long)pAVar25].m_backend.data._M_elems + 8) =
                     CONCAT35(uStack_6b3,_local_6b8);
                puVar2 = pnVar19[(long)pAVar25].m_backend.data._M_elems + 4;
                *(undefined8 *)puVar2 = local_6c8._0_8_;
                *(ulong *)(puVar2 + 2) = CONCAT35(uStack_6bb,stack0xfffffffffffff940);
                *(undefined1 (*) [8])pnVar19[(long)pAVar25].m_backend.data._M_elems = local_6d8;
                *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 (pnVar19[(long)pAVar25].m_backend.data._M_elems + 2) = _Stack_6d0._M_pi;
                pnVar19[(long)pAVar25].m_backend.exp = local_6b0;
                pnVar19[(long)pAVar25].m_backend.neg = local_6ac;
                *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                  **)&pnVar19[(long)pAVar25].m_backend.fpclass = local_6a8;
              }
            }
          }
          lVar28 = lVar28 + 1;
          lVar29 = lVar29 + 0x3c;
        } while (lVar28 < (pIVar7->data).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused);
      }
      pAVar25 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                 *)((long)&(local_5d8->data).
                           super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
      iVar17 = (lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum;
      lVar28 = (long)iVar17;
    } while ((long)pAVar25 < lVar28);
    if (iVar17 < 1) goto LAB_002e5040;
    local_590 = &local_6a0->m_hist;
    lVar29 = lVar28 + 1;
    local_65c = 0;
    lVar28 = lVar28 * 0x38;
    do {
      if (1 < (lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem
              [(lp->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[lVar29 + -2].idx].data.
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        puVar1 = (undefined8 *)
                 ((long)local_588.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                 lVar28);
        local_2c8 = (element_type *)*puVar1;
        _Stack_2c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
        puVar2 = (uint *)((long)local_588.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar28 + 0x10);
        local_2b8 = *(uint (*) [2])puVar2;
        uStack_2b0 = *(undefined8 *)(puVar2 + 2);
        local_2a8 = *(undefined8 *)
                     ((long)local_588.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                     lVar28 + 0x20);
        iVar17 = *(int *)((long)(&local_588.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1)
                         + lVar28);
        cVar3 = *(char *)((long)(&local_588.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1)
                         + lVar28 + 4);
        local_5f8 = *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                      **)((long)(&local_588.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1)
                         + lVar28 + 8);
        uStack_5f0 = 0;
        pnVar22 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    **)((long)local_570.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                       + lVar28 + 0x20);
        puVar1 = (undefined8 *)
                 ((long)local_570.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                 lVar28);
        local_2f8 = *puVar1;
        uStack_2f0 = puVar1[1];
        puVar2 = (uint *)((long)local_570.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar28 + 0x10);
        local_2e8 = *(uint (*) [2])puVar2;
        uStack_2e0 = *(undefined8 *)(puVar2 + 2);
        iVar18 = *(int *)((long)(&local_570.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1)
                         + lVar28);
        cVar4 = *(char *)((long)(&local_570.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1)
                         + lVar28 + 4);
        local_5d8 = *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                      **)((long)(&local_570.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1)
                         + lVar28 + 8);
        uStack_5d0 = 0;
        local_2d8 = pnVar22;
        opttol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)local_148,local_6a0);
        local_698._8_8_ = _Stack_2c0._M_pi;
        local_698._0_8_ = local_2c8;
        local_688[0] = local_2b8[0];
        local_688[1] = local_2b8[1];
        stack0xfffffffffffff980 = (undefined5)uStack_2b0;
        uStack_67b = (undefined3)((ulong)uStack_2b0 >> 0x28);
        _local_678 = (undefined5)local_2a8;
        uStack_673 = (undefined3)((ulong)local_2a8 >> 0x28);
        local_668 = local_5f8;
        local_658._8_8_ = uStack_2f0;
        local_658._0_8_ = local_2f8;
        local_648[0] = local_2e8[0];
        local_648[1] = local_2e8[1];
        stack0xfffffffffffff9c0 = (undefined5)uStack_2e0;
        uStack_63b = (undefined3)((ulong)uStack_2e0 >> 0x28);
        local_638 = local_2d8;
        local_628 = local_5d8;
        local_670 = iVar17;
        local_66c = (bool)cVar3;
        local_630 = iVar18;
        local_62c = (bool)cVar4;
        relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_6d8,(soplex *)local_698,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_658,pnVar22);
        local_5c8._0_8_ = local_148._0_8_;
        uVar9 = local_5c8._0_8_;
        local_5c8._8_8_ = local_148._8_8_;
        local_5c8._32_8_ = local_148._32_8_;
        local_5c8._16_8_ = local_148._16_8_;
        local_5c8._24_8_ = local_148._24_8_;
        local_5a0 = local_120;
        local_59c = local_11c;
        local_598 = local_118;
        local_5c8._0_4_ = (undefined4)local_148._0_8_;
        if (local_5c8._0_4_ != 0 || (int)local_118 != 0) {
          local_59c = (bool)(local_11c ^ 1);
        }
        local_5c8._0_8_ = uVar9;
        if ((((int)local_118 != 2) && ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) &&
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_6d8,
                                (cpp_dec_float<50U,_int,_void> *)local_5c8), iVar17 < 1)) {
          RVar26 = DUAL_INFEASIBLE;
          goto LAB_002e5297;
        }
        pnVar19 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).object.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_4a8 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      **)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x20);
        puVar1 = (undefined8 *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28);
        local_4c8 = (element_type *)*puVar1;
        _Stack_4c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
        puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x10);
        local_4b8 = *(uint (*) [2])puVar2;
        uStack_4b0 = *(undefined8 *)(puVar2 + 2);
        local_5f8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)CONCAT44(local_5f8._4_4_,
                                *(undefined4 *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28));
        cVar3 = *(char *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 4U);
        uVar6 = *(undefined4 *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 8U);
        local_5d8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)CONCAT44(local_5d8._4_4_,
                                *(undefined4 *)
                                 ((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 0xcU));
        local_308 = *(undefined8 *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x20);
        puVar1 = (undefined8 *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28);
        local_328 = (element_type *)*puVar1;
        _Stack_320._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
        puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x10);
        local_318 = *(uint (*) [2])puVar2;
        uStack_310 = *(undefined8 *)(puVar2 + 2);
        pnVar22 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    **)((long)local_588.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                       + lVar28 + 0x20);
        puVar1 = (undefined8 *)
                 ((long)local_588.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                 lVar28);
        local_358 = *puVar1;
        uStack_350 = puVar1[1];
        puVar2 = (uint *)((long)local_588.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar28 + 0x10);
        local_348 = *(uint (*) [2])puVar2;
        uStack_340 = *(undefined8 *)(puVar2 + 2);
        iVar17 = *(int *)((long)(&local_588.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1)
                         + lVar28);
        cVar4 = *(char *)((long)(&local_588.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1)
                         + lVar28 + 4);
        local_528 = *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                      **)((long)(&local_588.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1)
                         + lVar28 + 8);
        uStack_520 = 0;
        local_338 = pnVar22;
        opttol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)&local_68,local_6a0);
        local_698._8_8_ = _Stack_320._M_pi;
        local_698._0_8_ = local_328;
        local_688[0] = local_318[0];
        local_688[1] = local_318[1];
        stack0xfffffffffffff980 = (undefined5)uStack_310;
        uStack_67b = (undefined3)((ulong)uStack_310 >> 0x28);
        _local_678 = (undefined5)local_308;
        uStack_673 = (undefined3)((ulong)local_308 >> 0x28);
        local_670 = (int)local_5f8;
        local_668 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                     *)CONCAT44(local_5d8._0_4_,uVar6);
        local_658._8_8_ = uStack_350;
        local_658._0_8_ = local_358;
        local_648[0] = local_348[0];
        local_648[1] = local_348[1];
        stack0xfffffffffffff9c0 = (undefined5)uStack_340;
        uStack_63b = (undefined3)((ulong)uStack_340 >> 0x28);
        local_638 = local_338;
        local_628 = local_528;
        local_66c = (bool)cVar3;
        local_630 = iVar17;
        local_62c = (bool)cVar4;
        relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_6d8,(soplex *)local_698,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_658,pnVar22);
        if ((((fpclass_type)local_6a8 == cpp_dec_float_NaN) ||
            (local_68.fpclass == cpp_dec_float_NaN)) ||
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_6d8,&local_68), iVar17 < 1))
        {
          puVar1 = (undefined8 *)
                   ((long)local_570.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                   lVar28);
          local_388 = *puVar1;
          uStack_380 = puVar1[1];
          puVar2 = (uint *)((long)local_570.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                  _M_elems + lVar28 + 0x10);
          local_378 = *(uint (*) [2])puVar2;
          uStack_370 = *(undefined8 *)(puVar2 + 2);
          pnVar22 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      **)((long)local_570.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                _M_elems + lVar28 + 0x20);
          iVar17 = *(int *)((long)(&local_570.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1
                                  ) + lVar28);
          cVar4 = *(char *)((long)(&local_570.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1
                                  ) + lVar28 + 4);
          local_528 = *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                        **)((long)(&local_570.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data + 1
                                  ) + lVar28 + 8);
          uStack_520 = 0;
          local_368 = pnVar22;
          opttol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_180,local_6a0);
          local_698._8_8_ = _Stack_4c0._M_pi;
          local_698._0_8_ = local_4c8;
          local_688[0] = local_4b8[0];
          local_688[1] = local_4b8[1];
          stack0xfffffffffffff980 = (undefined5)uStack_4b0;
          uStack_67b = (undefined3)((ulong)uStack_4b0 >> 0x28);
          _local_678 = SUB85(local_4a8,0);
          uStack_673 = (undefined3)((ulong)local_4a8 >> 0x28);
          local_670 = (int)local_5f8;
          local_668 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                       *)CONCAT44(local_5d8._0_4_,uVar6);
          local_658._8_8_ = uStack_380;
          local_658._0_8_ = local_388;
          local_648[0] = local_378[0];
          local_648[1] = local_378[1];
          stack0xfffffffffffff9c0 = (undefined5)uStack_370;
          uStack_63b = (undefined3)((ulong)uStack_370 >> 0x28);
          local_638 = local_368;
          local_628 = local_528;
          local_66c = (bool)cVar3;
          local_630 = iVar17;
          local_62c = (bool)cVar4;
          relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_6d8,(soplex *)local_698,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)local_658,pnVar22);
          local_5c8._0_8_ = local_180._0_8_;
          uVar9 = local_5c8._0_8_;
          local_5c8._8_8_ = local_180._8_8_;
          local_5c8._32_8_ = local_180._32_8_;
          local_5c8._16_8_ = local_180._16_8_;
          local_5c8._24_8_ = local_180._24_8_;
          local_5a0 = local_158;
          local_59c = local_154;
          local_598 = local_150;
          local_5c8._0_4_ = (undefined4)local_180._0_8_;
          if (local_5c8._0_4_ != 0 || (int)local_150 != 0) {
            local_59c = (bool)(local_154 ^ 1);
          }
          local_5c8._0_8_ = uVar9;
          if ((((int)local_150 != 2) && ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)local_6d8,
                                  (cpp_dec_float<50U,_int,_void> *)local_5c8), iVar17 < 1)) {
            pnVar19 = (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ::soplex::infinity::__tls_init();
            local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                         *)0xa00000000;
            local_6d8 = (undefined1  [8])0x0;
            _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_6c8[0] = 0;
            local_6c8[1] = 0;
            stack0xfffffffffffff940 = 0;
            uStack_6bb = 0;
            _local_6b8 = 0;
            uStack_6b3 = 0;
            local_6b0 = 0;
            local_6ac = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)local_6d8,local_5e8);
            if (((*(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 8U) == 2) ||
                ((fpclass_type)local_6a8 == cpp_dec_float_NaN)) ||
               (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)
                                    ((long)pnVar19[-1].m_backend.data._M_elems + lVar28),
                                    (cpp_dec_float<50U,_int,_void> *)local_6d8), pSVar15 = local_6a0
               , 0 < iVar17)) {
              pnVar19 = (lp->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pFVar21 = (FixBoundsPS *)operator_new(0x30);
              local_218.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x20);
              puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28);
              local_218.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_218.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x10);
              local_218.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_218.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_218.m_backend.exp = *(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28);
              local_218.m_backend.neg =
                   *(bool *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 4U);
              local_218.m_backend._48_8_ =
                   *(undefined8 *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 8U);
              local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (local_6a0->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (local_6a0->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              FixBoundsPS::FixBoundsPS(pFVar21,lp,(int)(lVar29 - 2U),&local_218,&local_4f8);
              local_6d8 = (undefined1  [8])pFVar21;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6d8 + 8),pFVar21);
              if (local_4f8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_4f8.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&local_590->data,(value_type *)local_6d8);
              (*(lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x2d])
                        (lp,lVar29 - 2U & 0xffffffff,
                         (long)(lp->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).low.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                         + lVar28,0);
              goto LAB_002e4c81;
            }
            pSVar11 = (local_6a0->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            RVar26 = UNBOUNDED;
            if ((pSVar11 != (SPxOut *)0x0) && (3 < (int)pSVar11->m_verbosity)) {
              local_6d8._0_4_ = pSVar11->m_verbosity;
              local_698._0_4_ = 4;
              (*pSVar11->_vptr_SPxOut[2])();
              pSVar11 = (pSVar15->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).spxout;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar11->m_streams[pSVar11->m_verbosity]," unbounded",10);
              cVar3 = (char)pSVar11->m_streams[pSVar11->m_verbosity];
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)pSVar11->m_streams[pSVar11->m_verbosity] + -0x18) +
                              cVar3);
              std::ostream::put(cVar3);
              std::ostream::flush();
              pSVar11 = (pSVar15->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).spxout;
              (*pSVar11->_vptr_SPxOut[2])(pSVar11,local_6d8);
            }
            goto LAB_002e5297;
          }
          pnVar19 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_468._0_4_ = cpp_dec_float_finite;
          local_468._4_4_ = 10;
          local_498._0_16_ = (undefined1  [16])0x0;
          local_498._16_13_ = SUB1613((undefined1  [16])0x0,0);
          uStack_47b = 0;
          auStack_478 = SUB1613((undefined1  [16])0x0,3);
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_498,local_618);
          uVar9 = local_6c8._0_8_;
          if (((*(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 8U) != 2) &&
              ((fpclass_type)local_468 != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)pnVar19[-1].m_backend.data._M_elems + lVar28),
                                  (cpp_dec_float<50U,_int,_void> *)local_498),
             uVar9 = local_6c8._0_8_, iVar17 < 0)) {
            puVar2 = (uint *)((long)local_588.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                    _M_elems + lVar28);
            local_3b8 = *(uint (*) [2])puVar2;
            auStack_3b0 = *(uint (*) [2])(puVar2 + 2);
            puVar2 = (uint *)((long)local_588.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                    _M_elems + lVar28 + 0x10);
            local_3a8 = *(uint (*) [2])puVar2;
            auStack_3a0 = *(uint (*) [2])(puVar2 + 2);
            pnVar22 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        **)((long)local_588.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                  _M_elems + lVar28 + 0x20);
            iVar17 = *(int *)((long)(&local_588.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                                    1) + lVar28);
            bVar5 = *(byte *)((long)(&local_588.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                                    1) + lVar28 + 4);
            local_528 = *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                          **)((long)(&local_588.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                                    1) + lVar28 + 8);
            uStack_520 = 0;
            local_398 = pnVar22;
            opttol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_a0,local_6a0);
            local_658._8_8_ = _Stack_4c0._M_pi;
            local_658._0_8_ = local_4c8;
            local_648[0] = local_4b8[0];
            local_648[1] = local_4b8[1];
            stack0xfffffffffffff9c0 = (undefined5)uStack_4b0;
            uStack_63b = (undefined3)((ulong)uStack_4b0 >> 0x28);
            local_638 = local_4a8;
            local_630 = (int)local_5f8;
            local_628 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                         *)CONCAT44(local_5d8._0_4_,uVar6);
            local_5c8._0_4_ = local_3b8[0];
            local_5c8._4_4_ = local_3b8[1];
            local_5c8._8_4_ = auStack_3b0[0];
            local_5c8._12_4_ = auStack_3b0[1];
            local_5c8._16_4_ = local_3a8[0];
            local_5c8._20_4_ = local_3a8[1];
            local_5c8._24_4_ = auStack_3a0[0];
            local_5c8._28_4_ = auStack_3a0[1];
            local_5c8._32_8_ = local_398;
            local_598 = local_528;
            local_62c = (bool)cVar3;
            local_5a0 = iVar17;
            local_59c = (bool)bVar5;
            relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_698,(soplex *)local_658,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_5c8,pnVar22);
            _local_6b8 = _local_678;
            uStack_6b3 = uStack_673;
            uVar9._0_4_ = local_688[0];
            uVar9._4_4_ = local_688[1];
            local_6c8[0] = local_688[0];
            local_6c8[1] = local_688[1];
            stack0xfffffffffffff940 = stack0xfffffffffffff980;
            uStack_6bb = uStack_67b;
            local_6d8 = (undefined1  [8])local_698._0_8_;
            _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_698._8_8_;
            _Var16 = _local_6d8;
            local_6b0 = local_670;
            local_6ac = local_66c;
            local_6a8 = local_668;
            if ((local_66c == true) &&
               (local_6d8._0_4_ = local_698._0_4_, local_6d8._0_4_ != 0 || (int)local_668 != 0)) {
              local_6ac = false;
            }
            _local_6d8 = _Var16;
            if ((((int)local_668 == 2) ||
                (uVar9 = local_6c8._0_8_, local_a0.fpclass == cpp_dec_float_NaN)) ||
               (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                   ((cpp_dec_float<50U,_int,_void> *)local_6d8,&local_a0),
               uVar9 = local_6c8._0_8_, 0 < iVar17)) goto LAB_002e450b;
            pFVar21 = (FixBoundsPS *)operator_new(0x30);
            pnVar19 = (lp->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_258.m_backend.data._M_elems._32_8_ =
                 *(undefined8 *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x20);
            puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28);
            local_258.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
            local_258.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x10);
            local_258.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_258.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_258.m_backend.exp = *(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28);
            local_258.m_backend.neg =
                 *(bool *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 4U);
            local_258.m_backend._48_8_ =
                 *(undefined8 *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 8U);
            local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (local_6a0->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
            local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (local_6a0->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     )._tolerances.
                     super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                     _M_pi;
            if (local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            FixBoundsPS::FixBoundsPS(pFVar21,lp,(int)(lVar29 - 2U),&local_258,&local_508);
            local_6d8 = (undefined1  [8])pFVar21;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6d8 + 8),pFVar21);
            if (local_508.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_508.
                         super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
            std::
            vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
            ::push_back(&local_590->data,(value_type *)local_6d8);
            (*(lp->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .
              super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._vptr_ClassArray[0x2a])
                      (lp,lVar29 - 2U & 0xffffffff,
                       (long)(lp->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).up.val.
                             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                       lVar28,0);
LAB_002e502c:
            piVar10 = (local_6a0->m_stat).data + 0xb;
            *piVar10 = *piVar10 + 1;
            goto LAB_002e4c90;
          }
LAB_002e450b:
          local_6c8._0_8_ = uVar9;
          pnVar19 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).low.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_468._0_4_ = cpp_dec_float_finite;
          local_468._4_4_ = 10;
          local_498._0_16_ = (undefined1  [16])0x0;
          local_498._16_13_ = SUB1613((undefined1  [16])0x0,0);
          uStack_47b = 0;
          auStack_478 = SUB1613((undefined1  [16])0x0,3);
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_498,local_5e8);
          _Var16 = _local_6d8;
          if (((*(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 8U) != 2) &&
              ((fpclass_type)local_468 != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)pnVar19[-1].m_backend.data._M_elems + lVar28),
                                  (cpp_dec_float<50U,_int,_void> *)local_498), _Var16 = _local_6d8,
             0 < iVar17)) {
            puVar2 = (uint *)((long)local_570.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                    _M_elems + lVar28);
            local_3e8 = *(uint (*) [2])puVar2;
            auStack_3e0 = *(uint (*) [2])(puVar2 + 2);
            puVar2 = (uint *)((long)local_570.val.
                                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                    _M_elems + lVar28 + 0x10);
            local_3d8 = *(uint (*) [2])puVar2;
            auStack_3d0 = *(uint (*) [2])(puVar2 + 2);
            pnVar22 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        **)((long)local_570.val.
                                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data.
                                  _M_elems + lVar28 + 0x20);
            iVar17 = *(int *)((long)(&local_570.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                                    1) + lVar28);
            bVar5 = *(byte *)((long)(&local_570.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                                    1) + lVar28 + 4);
            local_528 = *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                          **)((long)(&local_570.val.
                                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data +
                                    1) + lVar28 + 8);
            uStack_520 = 0;
            local_3c8 = pnVar22;
            opttol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_d8,local_6a0);
            local_658._8_8_ = _Stack_4c0._M_pi;
            local_658._0_8_ = local_4c8;
            local_648[0] = local_4b8[0];
            local_648[1] = local_4b8[1];
            stack0xfffffffffffff9c0 = (undefined5)uStack_4b0;
            uStack_63b = (undefined3)((ulong)uStack_4b0 >> 0x28);
            local_638 = local_4a8;
            local_630 = (int)local_5f8;
            local_628 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                         *)CONCAT44(local_5d8._0_4_,uVar6);
            local_5c8._0_4_ = local_3e8[0];
            local_5c8._4_4_ = local_3e8[1];
            local_5c8._8_4_ = auStack_3e0[0];
            local_5c8._12_4_ = auStack_3e0[1];
            local_5c8._16_4_ = local_3d8[0];
            local_5c8._20_4_ = local_3d8[1];
            local_5c8._24_4_ = auStack_3d0[0];
            local_5c8._28_4_ = auStack_3d0[1];
            local_5c8._32_8_ = local_3c8;
            local_598 = local_528;
            local_62c = (bool)cVar3;
            local_5a0 = iVar17;
            local_59c = (bool)bVar5;
            relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_698,(soplex *)local_658,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)local_5c8,pnVar22);
            _local_6b8 = _local_678;
            uStack_6b3 = uStack_673;
            local_6c8[0] = local_688[0];
            local_6c8[1] = local_688[1];
            stack0xfffffffffffff940 = stack0xfffffffffffff980;
            uStack_6bb = uStack_67b;
            local_6d8 = (undefined1  [8])local_698._0_8_;
            _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_698._8_8_;
            _Var16 = _local_6d8;
            local_6b0 = local_670;
            local_6ac = local_66c;
            local_6a8 = local_668;
            if ((local_66c == true) &&
               (local_6d8._0_4_ = local_698._0_4_, local_6d8._0_4_ != 0 || (int)local_668 != 0)) {
              local_6ac = false;
            }
            if ((((int)local_668 != 2) && (local_d8.fpclass != cpp_dec_float_NaN)) &&
               (_local_6d8 = _Var16,
               iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                  ((cpp_dec_float<50U,_int,_void> *)local_6d8,&local_d8),
               _Var16 = _local_6d8, iVar17 < 1)) {
              pFVar21 = (FixBoundsPS *)operator_new(0x30);
              pnVar19 = (lp->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).low.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              local_298.m_backend.data._M_elems._32_8_ =
                   *(undefined8 *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x20);
              puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28);
              local_298.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_298.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x10);
              local_298.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_298.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              local_298.m_backend.exp = *(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28);
              local_298.m_backend.neg =
                   *(bool *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 4U);
              local_298.m_backend._48_8_ =
                   *(undefined8 *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 8U);
              local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (local_6a0->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
              local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi =
                   (local_6a0->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
              if (local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi)->_M_use_count =
                       (local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              FixBoundsPS::FixBoundsPS(pFVar21,lp,(int)(lVar29 - 2U),&local_298,&local_518);
              local_6d8 = (undefined1  [8])pFVar21;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
              __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6d8 + 8),pFVar21);
              if (local_518.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_518.
                           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              std::
              vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
              ::push_back(&local_590->data,(value_type *)local_6d8);
              (*(lp->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .
                super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._vptr_ClassArray[0x2d])
                        (lp,lVar29 - 2U & 0xffffffff,
                         (long)(lp->
                               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).low.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems
                         + lVar28,0);
              goto LAB_002e502c;
            }
          }
        }
        else {
          pnVar19 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          ::soplex::infinity::__tls_init();
          local_6a8 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                       *)0xa00000000;
          local_6d8 = (undefined1  [8])0x0;
          _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_6c8[0] = 0;
          local_6c8[1] = 0;
          stack0xfffffffffffff940 = 0;
          uStack_6bb = 0;
          _local_6b8 = 0;
          uStack_6b3 = 0;
          local_6b0 = 0;
          local_6ac = false;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)local_6d8,local_618);
          if (((*(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 8U) != 2) &&
              ((fpclass_type)local_6a8 != cpp_dec_float_NaN)) &&
             (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                                 ((cpp_dec_float<50U,_int,_void> *)
                                  ((long)pnVar19[-1].m_backend.data._M_elems + lVar28),
                                  (cpp_dec_float<50U,_int,_void> *)local_6d8), pSVar15 = local_6a0,
             -1 < iVar17)) {
            pSVar11 = (local_6a0->
                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).spxout;
            RVar26 = UNBOUNDED;
            if ((pSVar11 != (SPxOut *)0x0) && (3 < (int)pSVar11->m_verbosity)) {
              local_6d8._0_4_ = pSVar11->m_verbosity;
              local_698._0_4_ = 4;
              (*pSVar11->_vptr_SPxOut[2])();
              pSVar11 = (pSVar15->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).spxout;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar11->m_streams[pSVar11->m_verbosity]," unbounded",10);
              cVar3 = (char)pSVar11->m_streams[pSVar11->m_verbosity];
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)pSVar11->m_streams[pSVar11->m_verbosity] + -0x18) +
                              cVar3);
              std::ostream::put(cVar3);
              std::ostream::flush();
              pSVar11 = (pSVar15->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).spxout;
              (*pSVar11->_vptr_SPxOut[2])(pSVar11,local_6d8);
            }
            goto LAB_002e5297;
          }
          pnVar19 = (lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pFVar21 = (FixBoundsPS *)operator_new(0x30);
          local_1d8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x20);
          puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28);
          local_1d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)puVar2;
          local_1d8.m_backend.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
          puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x10);
          local_1d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
          local_1d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
          local_1d8.m_backend.exp = *(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28);
          local_1d8.m_backend.neg = *(bool *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 4U)
          ;
          local_1d8.m_backend._48_8_ =
               *(undefined8 *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 8U);
          local_4e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (local_6a0->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
          local_4e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (local_6a0->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          if (local_4e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_4e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_4e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_4e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_4e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          FixBoundsPS::FixBoundsPS(pFVar21,lp,(int)(lVar29 - 2U),&local_1d8,&local_4e8);
          local_6d8 = (undefined1  [8])pFVar21;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>::FixBoundsPS*>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_6d8 + 8),pFVar21);
          if (local_4e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_4e8.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          std::
          vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
          ::push_back(&local_590->data,(value_type *)local_6d8);
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x2a])
                    (lp,lVar29 - 2U & 0xffffffff,
                     (long)(lp->
                           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).up.val.
                           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                     lVar28,0);
LAB_002e4c81:
          piVar10 = (local_6a0->m_stat).data + 10;
          *piVar10 = *piVar10 + 1;
LAB_002e4c90:
          _Var16 = _local_6d8;
          if (_Stack_6d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_6d0._M_pi);
            _Var16 = _local_6d8;
          }
        }
        _local_6d8 = _Var16;
        pnVar19 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).low.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_3f8 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      **)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x20);
        puVar1 = (undefined8 *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28);
        local_418 = *puVar1;
        uStack_410 = puVar1[1];
        puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x10);
        local_408 = *(uint (*) [2])puVar2;
        uStack_400 = *(undefined8 *)(puVar2 + 2);
        iVar17 = *(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28);
        cVar3 = *(char *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 4U);
        local_5f8 = *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                      **)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 8U);
        uStack_5f0 = 0;
        pnVar19 = (lp->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).up.val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pnVar22 = *(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    **)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x20);
        puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28);
        local_448 = *(uint (*) [2])puVar2;
        auStack_440 = *(uint (*) [2])(puVar2 + 2);
        puVar2 = (uint *)((long)pnVar19[-1].m_backend.data._M_elems + lVar28 + 0x10);
        local_438 = *(uint (*) [2])puVar2;
        auStack_430 = *(uint (*) [2])(puVar2 + 2);
        iVar18 = *(int *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28);
        bVar5 = *(byte *)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 4U);
        local_5d8 = *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                      **)((long)(&pnVar19[-1].m_backend.data + 1) + lVar28 + 8U);
        uStack_5d0 = 0;
        local_428 = pnVar22;
        feastol((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&local_110,local_6a0);
        local_658._8_8_ = uStack_410;
        local_658._0_8_ = local_418;
        local_648[0] = local_408[0];
        local_648[1] = local_408[1];
        stack0xfffffffffffff9c0 = (undefined5)uStack_400;
        uStack_63b = (undefined3)((ulong)uStack_400 >> 0x28);
        local_638 = local_3f8;
        local_628 = local_5f8;
        local_5c8._0_4_ = local_448[0];
        local_5c8._4_4_ = local_448[1];
        local_5c8._8_4_ = auStack_440[0];
        local_5c8._12_4_ = auStack_440[1];
        local_5c8._16_4_ = local_438[0];
        local_5c8._20_4_ = local_438[1];
        local_5c8._24_4_ = auStack_430[0];
        local_5c8._28_4_ = auStack_430[1];
        local_5c8._32_8_ = local_428;
        local_598 = local_5d8;
        local_630 = iVar17;
        local_62c = (bool)cVar3;
        local_5a0 = iVar18;
        local_59c = (bool)bVar5;
        relDiff<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_698,(soplex *)local_658,
                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_5c8,pnVar22);
        _local_6b8 = _local_678;
        uStack_6b3 = uStack_673;
        local_6c8[0] = local_688[0];
        local_6c8[1] = local_688[1];
        stack0xfffffffffffff940 = stack0xfffffffffffff980;
        uStack_6bb = uStack_67b;
        local_6d8 = (undefined1  [8])local_698._0_8_;
        _Stack_6d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_698._8_8_;
        _Var16 = _local_6d8;
        local_6b0 = local_670;
        local_6ac = local_66c;
        local_6a8 = local_668;
        if ((local_66c == true) &&
           (local_6d8._0_4_ = local_698._0_4_, local_6d8._0_4_ != 0 || (int)local_668 != 0)) {
          local_6ac = false;
        }
        _local_6d8 = _Var16;
        if ((((int)local_668 != 2) && (local_110.fpclass != cpp_dec_float_NaN)) &&
           (iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                               ((cpp_dec_float<50U,_int,_void> *)local_6d8,&local_110), iVar17 < 1))
        {
          fixColumn(local_6a0,lp,(int)(lVar29 - 2U),true);
          iVar17 = (lp->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.theitem
                   [(lp->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thekey[lVar29 + -2].idx].data.
                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .memused;
          piVar10 = (local_6a0->m_cIdx).data;
          piVar10[lVar29 + -2] =
               piVar10[(long)(lp->
                             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ).
                             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             .set.thenum + -1];
          (*(lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._vptr_ClassArray[0x15])(lp,lVar29 - 2U & 0xffffffff);
          local_65c = local_65c + 1;
          local_61c = local_61c + iVar17;
          piVar10 = (local_6a0->m_stat).data + 5;
          *piVar10 = *piVar10 + 1;
        }
      }
      lVar29 = lVar29 + -1;
      lVar28 = lVar28 + -0x38;
    } while (1 < lVar29);
  }
  lVar28 = local_450;
  iVar18 = local_5fc;
  iVar17 = local_61c;
  pSVar15 = local_6a0;
  uVar23 = local_65c + local_5fc;
  if (uVar23 != 0 && SCARRY4(local_65c,local_5fc) == (int)uVar23 < 0) {
    piVar10 = &(local_6a0->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remRows;
    *piVar10 = *piVar10 + local_5fc;
    piVar10 = &(local_6a0->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remCols;
    *piVar10 = *piVar10 + local_65c;
    piVar10 = &(local_6a0->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_remNzos;
    *piVar10 = *piVar10 + local_61c;
    pSVar11 = (local_6a0->
              super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).spxout;
    if ((pSVar11 != (SPxOut *)0x0) && (3 < (int)pSVar11->m_verbosity)) {
      local_6d8._0_4_ = pSVar11->m_verbosity;
      local_698._0_4_ = 4;
      (*pSVar11->_vptr_SPxOut[2])();
      pSVar11 = (pSVar15->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar11->m_streams[pSVar11->m_verbosity],"Simplifier (dual) removed ",0x1a);
      std::ostream::operator<<((ostream *)pSVar11->m_streams[pSVar11->m_verbosity],iVar18);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar11->m_streams[pSVar11->m_verbosity]," rows, ",7);
      std::ostream::operator<<((ostream *)pSVar11->m_streams[pSVar11->m_verbosity],local_65c);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar11->m_streams[pSVar11->m_verbosity]," cols, ",7);
      std::ostream::operator<<((ostream *)pSVar11->m_streams[pSVar11->m_verbosity],iVar17);
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar11->m_streams[pSVar11->m_verbosity]," non-zeros",10);
      cVar3 = (char)pSVar11->m_streams[pSVar11->m_verbosity];
      std::ios::widen((char)*(undefined8 *)
                             (*(long *)pSVar11->m_streams[pSVar11->m_verbosity] + -0x18) + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      pSVar11 = (pSVar15->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).spxout;
      (*pSVar11->_vptr_SPxOut[2])(pSVar11,local_6d8);
    }
    local_668 = (Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                 *)0xa00000000;
    local_698._0_8_ = (element_type *)0x0;
    local_698._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_688[0] = 0;
    local_688[1] = 0;
    stack0xfffffffffffff980 = 0;
    uStack_67b = 0;
    _local_678 = 0;
    uStack_673 = 0;
    local_670 = 0;
    local_66c = false;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              ((cpp_dec_float<50U,_int,_void> *)local_6d8,lVar28 + local_458,(type *)0x0);
    pnVar22 = &(pSVar15->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).m_minReduction;
    if ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         *)local_698 !=
        (__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
         *)pnVar22) {
      uVar9 = *(undefined8 *)
               ((pSVar15->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_minReduction.m_backend.data._M_elems + 8);
      _local_678 = (undefined5)uVar9;
      uStack_673 = (undefined3)((ulong)uVar9 >> 0x28);
      local_698 = *(undefined1 (*) [16])(pnVar22->m_backend).data._M_elems;
      local_688._0_8_ =
           *(undefined8 *)
            ((pSVar15->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).m_minReduction.m_backend.data._M_elems + 4);
      uVar9 = *(undefined8 *)
               ((pSVar15->
                super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).m_minReduction.m_backend.data._M_elems + 6);
      stack0xfffffffffffff980 = (undefined5)uVar9;
      uStack_67b = (undefined3)((ulong)uVar9 >> 0x28);
      local_670 = (pSVar15->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_minReduction.m_backend.exp;
      local_66c = (pSVar15->
                  super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).m_minReduction.m_backend.neg;
      local_668 = *(Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
                    **)&(pSVar15->
                        super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).m_minReduction.m_backend.fpclass;
    }
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              ((cpp_dec_float<50U,_int,_void> *)local_698,(cpp_dec_float<50U,_int,_void> *)local_6d8
              );
    if ((fpclass_type)local_668 != cpp_dec_float_NaN) {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                ((cpp_dec_float<50U,_int,_void> *)local_6d8,(ulong)uVar23,(type *)0x0);
      iVar17 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         ((cpp_dec_float<50U,_int,_void> *)local_698,
                          (cpp_dec_float<50U,_int,_void> *)local_6d8);
      RVar26 = OKAY;
      if (iVar17 < 0) {
        *local_460 = true;
      }
      goto LAB_002e5297;
    }
  }
  RVar26 = OKAY;
LAB_002e5297:
  if (local_588.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_588.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_588.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_588.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_570.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_570.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_570.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_570.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_558.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_558.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_558.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_558.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_540.val.
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_540.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_540.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_540.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_190 != (bool *)0x0) {
    free(local_190);
  }
  return RVar26;
}

Assistant:

typename SPxSimplifier<R>::Result SPxMainSM<R>::simplifyDual(SPxLPBase<R>& lp, bool& again)
{

   // This method simplifies LP using the following dual structures:
   //
   // 1. dominated columns
   // 2. weakly dominated columns
   //
   // For constructing the dual variables, it is assumed that the objective sense is max

   int remRows = 0;
   int remCols = 0;
   int remNzos = 0;

   int oldRows = lp.nRows();
   int oldCols = lp.nCols();

   DataArray<bool> colSingleton(lp.nCols());
   VectorBase<R>         dualVarLo(lp.nRows());
   VectorBase<R>         dualVarUp(lp.nRows());
   VectorBase<R>         dualConsLo(lp.nCols());
   VectorBase<R>         dualConsUp(lp.nCols());

   // init
   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      // check for unconstrained constraints
      if(lp.lhs(i) <= R(-infinity) && lp.rhs(i) >= R(infinity))
      {
         SPxOut::debug(this, "IMAISM43 row {}: unconstrained\n", i);

         std::shared_ptr<PostStep> ptr(new FreeConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         ++remRows;
         remNzos += lp.rowVector(i).size();
         removeRow(lp, i);

         ++m_stat[FREE_ROW];

         continue;
      }

      // corresponds to maximization sense
      dualVarLo[i] = (lp.lhs(i) <= R(-infinity)) ? 0.0 : R(-infinity);
      dualVarUp[i] = (lp.rhs(i) >=  R(infinity)) ? 0.0 :  R(infinity);
   }

   // compute bounds on the dual variables using column singletons
   for(int j = 0; j < lp.nCols(); ++j)
   {
      if(lp.colVector(j).size() == 1)
      {
         int  i   = lp.colVector(j).index(0);
         R aij = lp.colVector(j).value(0);

         SOPLEX_ASSERT_WARN("WMAISM44", isNotZero(aij, R(1.0 / R(infinity))));

         R bound = lp.maxObj(j) / aij;

         if(aij > 0)
         {
            if(lp.lower(j) <= R(-infinity) && bound < dualVarUp[i])
               dualVarUp[i] = bound;

            if(lp.upper(j) >=  R(infinity) && bound > dualVarLo[i])
               dualVarLo[i] = bound;
         }
         else if(aij < 0)
         {
            if(lp.lower(j) <= R(-infinity) && bound > dualVarLo[i])
               dualVarLo[i] = bound;

            if(lp.upper(j) >=  R(infinity) && bound < dualVarUp[i])
               dualVarUp[i] = bound;
         }
      }

   }

   // compute bounds on the dual constraints
   for(int j = 0; j < lp.nCols(); ++j)
   {
      dualConsLo[j] = dualConsUp[j] = 0.0;

      const SVectorBase<R>& col = lp.colVector(j);

      for(int k = 0; k < col.size(); ++k)
      {
         if(dualConsLo[j] <= R(-infinity) && dualConsUp[j] >= R(infinity))
            break;

         R aij = col.value(k);
         int  i   = col.index(k);

         SOPLEX_ASSERT_WARN("WMAISM45", isNotZero(aij, R(1.0 / R(infinity))));

         if(aij > 0)
         {
            if(dualVarLo[i] <= R(-infinity))
               dualConsLo[j] = R(-infinity);
            else
               dualConsLo[j] += aij * dualVarLo[i];

            if(dualVarUp[i] >= R(infinity))
               dualConsUp[j] = R(infinity);
            else
               dualConsUp[j] += aij * dualVarUp[i];
         }
         else if(aij < 0)
         {
            if(dualVarLo[i] <= R(-infinity))
               dualConsUp[j] = R(infinity);
            else
               dualConsUp[j] += aij * dualVarLo[i];

            if(dualVarUp[i] >= R(infinity))
               dualConsLo[j] = R(-infinity);
            else
               dualConsLo[j] += aij * dualVarUp[i];
         }
      }
   }

   for(int j = lp.nCols() - 1; j >= 0; --j)
   {
      if(lp.colVector(j).size() <= 1)
         continue;

      // dual infeasibility checks
      if(LTrel(dualConsUp[j], dualConsLo[j], opttol()))
      {
         SPxOut::debug(this, "IMAISM46 col {}: dual infeasible -> dual lhs bound={} dual rhs bound={}\n", j,
                       dualConsLo[j], dualConsUp[j]);
         return this->DUAL_INFEASIBLE;
      }

      R obj = lp.maxObj(j);

      // 1. dominated column
      // Is the problem really unbounded in the cases below ??? Or is only dual infeasibility be shown
      if(GTrel(obj, dualConsUp[j], opttol()))
      {
#if SOPLEX_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM47 col{}: dominated -> maxObj={} dual rhs bound={}\n", j, obj,
                       dualConsUp[j]);

         if(lp.upper(j) >= R(infinity))
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " unbounded" << std::endl;)
            return this->UNBOUNDED;
         }

         SPxOut::debug(this, " fixed at upper={}\n", lp.upper(j));

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.upper(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeLower(j, lp.upper(j));

         ++m_stat[DOMINATED_COL];
#endif
      }
      else if(LTrel(obj, dualConsLo[j], opttol()))
      {
#if SOPLEX_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM48 col {}: dominated -> maxObj={} dual lhs bound={}\n", j, obj,
                       dualConsLo[j]);

         if(lp.lower(j) <= R(-infinity))
         {
            SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " unbounded" << std::endl;)
            return this->UNBOUNDED;
         }

         SPxOut::debug(this, " fixed at lower={}\n", lp.lower(j));

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.lower(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeUpper(j, lp.lower(j));

         ++m_stat[DOMINATED_COL];
#endif
      }

      // 2. weakly dominated column (no postsolving)
      else if(lp.upper(j) < R(infinity) && EQrel(obj, dualConsUp[j], opttol()))
      {
#if SOPLEX_WEAKLY_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM49 col {}: weakly dominated -> maxObj={} dual rhs bound={}\n", j, obj,
                       dualConsUp[j]);

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.upper(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeLower(j, lp.upper(j));

         ++m_stat[WEAKLY_DOMINATED_COL];
#endif
      }
      else if(lp.lower(j) > R(-infinity) && EQrel(obj, dualConsLo[j], opttol()))
      {
#if SOPLEX_WEAKLY_DOMINATED_COLUMN
         SPxOut::debug(this, "IMAISM50 col {}: weakly dominated -> maxObj={} dual lhs bound={}\n", j, obj,
                       dualConsLo[j]);

         std::shared_ptr<PostStep> ptr(new FixBoundsPS(lp, j, lp.lower(j), this->_tolerances));
         m_hist.append(ptr);
         lp.changeUpper(j, lp.lower(j));

         ++m_stat[WEAKLY_DOMINATED_COL];
#endif
      }

      // fix column
      if(EQrel(lp.lower(j), lp.upper(j), feastol()))
      {
#if SOPLEX_FIX_VARIABLE
         fixColumn(lp, j);

         ++remCols;
         remNzos += lp.colVector(j).size();
         removeCol(lp, j);

         ++m_stat[FIX_COL];
#endif
      }
   }


   assert(remRows > 0 || remCols > 0 || remNzos == 0);

   if(remCols + remRows > 0)
   {
      this->m_remRows += remRows;
      this->m_remCols += remCols;
      this->m_remNzos += remNzos;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (dual) removed "
                    << remRows << " rows, "
                    << remCols << " cols, "
                    << remNzos << " non-zeros"
                    << std::endl;)

      if(remCols + remRows > this->m_minReduction * (oldCols + oldRows))
         again = true;
   }

   return this->OKAY;
}